

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Parser_TestInvalidComprehension_Test::
~Parser_TestInvalidComprehension_Test(Parser_TestInvalidComprehension_Test *this)

{
  void *in_RDI;
  
  ~Parser_TestInvalidComprehension_Test((Parser_TestInvalidComprehension_Test *)0x19e228);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Parser, TestInvalidComprehension)
{
    testParseError("{assert x for x in [1, 2, 3]}",
                   "test:1:11-14: object comprehension cannot have asserts.");
    testParseError("{['foo' + x]: true, [x]: x for x in [1, 2, 3]}",
                   "test:1:28-31: object comprehension can only have one field.");
    testParseError("{foo: x for x in [1, 2, 3]}",
                   "test:1:9-12: object comprehensions can only have [e] fields.");
    testParseError("{[x]:: true for x in [1, 2, 3]}",
                   "test:1:13-16: object comprehensions cannot have hidden fields.");
    testParseError("{[x]: true for 1 in [1, 2, 3]}",
                   R"(test:1:16: expected token IDENTIFIER but got (NUMBER, "1"))");
    testParseError("{[x]: true for x at [1, 2, 3]}",
                   R"(test:1:18-20: expected token in but got (IDENTIFIER, "at"))");
    testParseError("{[x]: true for x in [1, 2 3]}",
                   "test:1:27: expected a comma before next array element.");
    testParseError("{[x]: true for x in [1, 2, 3] if (a b)}",
                   R"_(test:1:37: expected token ")" but got (IDENTIFIER, "b"))_");
    testParseError("{[x]: true for x in [1, 2, 3] if a b}",
                   R"(test:1:36: expected for, if or "}" after for clause,)"
                   R"( got: (IDENTIFIER, "b"))");
}